

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Table.cxx
# Opt level: O0

long __thiscall Fl_Table::col_scroll_position(Fl_Table *this,int col)

{
  int iVar1;
  int local_24;
  long lStack_20;
  int t;
  long scroll;
  int startcol;
  int col_local;
  Fl_Table *this_local;
  
  scroll._0_4_ = 0;
  lStack_20 = 0;
  if ((this->leftcol_scrollpos != -1) && (this->leftcol <= col)) {
    lStack_20 = (long)this->leftcol_scrollpos;
    scroll._0_4_ = this->leftcol;
  }
  for (local_24 = (int)scroll; local_24 < col; local_24 = local_24 + 1) {
    iVar1 = col_width(this,local_24);
    lStack_20 = iVar1 + lStack_20;
  }
  return lStack_20;
}

Assistant:

long Fl_Table::col_scroll_position(int col) {
  int startcol = 0;
  long scroll = 0;
  // OPTIMIZATION: 
  //     Attempt to use precomputed row scroll position
  //
  if ( leftcol_scrollpos != -1 && col >= leftcol ) {
    scroll = leftcol_scrollpos;
    startcol = leftcol;
  }
  for ( int t=startcol; t<col; t++ ) {
    scroll += col_width(t);
  }
  return(scroll);
}